

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

string * glu::sl::removeExtraIndentation(string *__return_storage_ptr__,string *source)

{
  char c_00;
  int iVar1;
  deBool dVar2;
  char *pcVar3;
  bool bVar4;
  int local_1a4;
  int iStack_1a0;
  char c;
  int pos;
  int indentCharsOmitted;
  bool atLineStart;
  ostringstream processed;
  int local_20;
  int local_1c;
  int ndx;
  int numIndentChars;
  string *source_local;
  
  local_1c = 0;
  local_20 = 0;
  while( true ) {
    iVar1 = std::__cxx11::string::length();
    bVar4 = false;
    if (local_20 < iVar1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)source);
      dVar2 = isWhitespace(*pcVar3);
      bVar4 = dVar2 != 0;
    }
    if (!bVar4) break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)source);
    iVar1 = 1;
    if (*pcVar3 == '\t') {
      iVar1 = 4;
    }
    local_1c = iVar1 + local_1c;
    local_20 = local_20 + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&indentCharsOmitted);
  bVar4 = true;
  iStack_1a0 = 0;
  for (local_1a4 = 0; iVar1 = std::__cxx11::string::length(), local_1a4 < iVar1;
      local_1a4 = local_1a4 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)source);
    c_00 = *pcVar3;
    if (((bVar4) && (iStack_1a0 < local_1c)) && ((c_00 == ' ' || (c_00 == '\t')))) {
      iVar1 = 1;
      if (c_00 == '\t') {
        iVar1 = 4;
      }
      iStack_1a0 = iVar1 + iStack_1a0;
    }
    else {
      dVar2 = isEOL(c_00);
      if (dVar2 == 0) {
        std::operator<<((ostream *)&indentCharsOmitted,c_00);
        bVar4 = false;
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)source);
        if ((*pcVar3 == '\r') &&
           (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)source), *pcVar3 == '\n')) {
          local_1a4 = local_1a4 + 1;
          std::operator<<((ostream *)&indentCharsOmitted,'\n');
        }
        else {
          std::operator<<((ostream *)&indentCharsOmitted,c_00);
        }
        bVar4 = true;
        iStack_1a0 = 0;
      }
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indentCharsOmitted);
  return __return_storage_ptr__;
}

Assistant:

static string removeExtraIndentation (const string& source)
{
	// Detect indentation from first line.
	int numIndentChars = 0;
	for (int ndx = 0; ndx < (int)source.length() && isWhitespace(source[ndx]); ndx++)
		numIndentChars += source[ndx] == '\t' ? 4 : 1;

	// Process all lines and remove preceding indentation.
	ostringstream processed;
	{
		bool	atLineStart			= true;
		int		indentCharsOmitted	= 0;

		for (int pos = 0; pos < (int)source.length(); pos++)
		{
			char c = source[pos];

			if (atLineStart && indentCharsOmitted < numIndentChars && (c == ' ' || c == '\t'))
			{
				indentCharsOmitted += c == '\t' ? 4 : 1;
			}
			else if (isEOL(c))
			{
				if (source[pos] == '\r' && source[pos+1] == '\n')
				{
					pos += 1;
					processed << '\n';
				}
				else
					processed << c;

				atLineStart			= true;
				indentCharsOmitted	= 0;
			}
			else
			{
				processed << c;
				atLineStart = false;
			}
		}
	}

	return processed.str();
}